

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O2

string * __thiscall
duckdb::ExpressionTypeToOperator_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ExpressionType type)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x19:
    pcVar3 = "=";
    paVar2 = &local_9;
    break;
  case 0x1a:
    pcVar3 = "!=";
    paVar2 = &local_a;
    break;
  case 0x1b:
    pcVar3 = "<";
    paVar2 = &local_b;
    break;
  case 0x1c:
    pcVar3 = ">";
    paVar2 = &local_c;
    break;
  case 0x1d:
    pcVar3 = "<=";
    paVar2 = &local_d;
    break;
  case 0x1e:
    pcVar3 = ">=";
    paVar2 = &local_e;
    break;
  case 0x25:
    pcVar3 = "IS DISTINCT FROM";
    paVar2 = &local_f;
    break;
  case 0x28:
    pcVar3 = "IS NOT DISTINCT FROM";
    paVar2 = &local_10;
    break;
  default:
    if (iVar1 == 0x32) {
      pcVar3 = "AND";
      paVar2 = &local_11;
      break;
    }
    if (iVar1 == 0x33) {
      pcVar3 = "OR";
      paVar2 = &local_12;
      break;
    }
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
    pcVar3 = anon_var_dwarf_4b71df5 + 9;
    paVar2 = &local_13;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTypeToOperator(ExpressionType type) {
	switch (type) {
	case ExpressionType::COMPARE_EQUAL:
		return "=";
	case ExpressionType::COMPARE_NOTEQUAL:
		return "!=";
	case ExpressionType::COMPARE_LESSTHAN:
		return "<";
	case ExpressionType::COMPARE_GREATERTHAN:
		return ">";
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return "<=";
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return ">=";
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return "IS DISTINCT FROM";
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return "IS NOT DISTINCT FROM";
	case ExpressionType::CONJUNCTION_AND:
		return "AND";
	case ExpressionType::CONJUNCTION_OR:
		return "OR";
	default:
		return "";
	}
}